

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O0

Byte __thiscall
CFFEmbeddedFontWriter::GetMostCompressedOffsetSize
          (CFFEmbeddedFontWriter *this,unsigned_long inOffset)

{
  unsigned_long inOffset_local;
  CFFEmbeddedFontWriter *this_local;
  
  if (inOffset < 0x100) {
    this_local._7_1_ = '\x01';
  }
  else if (inOffset < 0x10000) {
    this_local._7_1_ = '\x02';
  }
  else if (inOffset < 0x1000000) {
    this_local._7_1_ = '\x03';
  }
  else {
    this_local._7_1_ = '\x04';
  }
  return this_local._7_1_;
}

Assistant:

Byte CFFEmbeddedFontWriter::GetMostCompressedOffsetSize(unsigned long inOffset)
{
	if(inOffset < 256)
		return 1;
	
	if(inOffset < 65536)
		return 2;

	if(inOffset < 1<<24)
		return 3;

	return 4;
}